

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O1

unsigned_long ReadVarInt<SpanReader,(VarIntMode)0,unsigned_long>(SpanReader *is)

{
  char *pcVar1;
  size_t in_RCX;
  ulong uVar2;
  unsigned_long unaff_R14;
  unsigned_long uVar3;
  long in_FS_OFFSET;
  uint8_t obj;
  uint local_40 [2];
  undefined8 local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = 0;
  do {
    SpanReader::read(is,(int)local_40,(void *)0x1,in_RCX);
    if (uVar2 >> 0x39 != 0) {
      pcVar1 = (char *)__cxa_allocate_exception(0x20);
      local_38 = std::iostream_category();
      local_40[0] = 1;
      std::ios_base::failure[abi:cxx11]::failure
                (pcVar1,(error_code *)"ReadVarInt(): size too large");
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        __cxa_throw(pcVar1,&std::ios_base::failure[abi:cxx11]::typeinfo,
                    std::ios_base::failure[abi:cxx11]::~failure);
      }
      goto LAB_0031e790;
    }
    in_RCX = uVar2 << 7;
    uVar2 = local_40[0] & 0x7f | in_RCX;
    uVar3 = uVar2;
    if ((char)local_40[0] < '\0') {
      if (uVar2 == 0xffffffffffffffff) {
        pcVar1 = (char *)__cxa_allocate_exception(0x20);
        local_38 = std::iostream_category();
        local_40[0] = 1;
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar1,(error_code *)"ReadVarInt(): size too large");
        if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
          __cxa_throw(pcVar1,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_0031e790;
      }
      uVar2 = uVar2 + 1;
      uVar3 = unaff_R14;
    }
    unaff_R14 = uVar3;
  } while ((char)local_40[0] < '\0');
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return uVar3;
  }
LAB_0031e790:
  __stack_chk_fail();
}

Assistant:

I ReadVarInt(Stream& is)
{
    CheckVarIntMode<Mode, I>();
    I n = 0;
    while(true) {
        unsigned char chData = ser_readdata8(is);
        if (n > (std::numeric_limits<I>::max() >> 7)) {
           throw std::ios_base::failure("ReadVarInt(): size too large");
        }
        n = (n << 7) | (chData & 0x7F);
        if (chData & 0x80) {
            if (n == std::numeric_limits<I>::max()) {
                throw std::ios_base::failure("ReadVarInt(): size too large");
            }
            n++;
        } else {
            return n;
        }
    }
}